

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O3

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,Joint *joint)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  SpatialVector *pSVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  SpatialVector *pSVar9;
  long lVar10;
  ulong uVar11;
  
  uVar6 = joint->mDoFCount;
  uVar7 = joint->q_index;
  uVar8 = joint->custom_joint_index;
  uVar3 = joint->mDoFCount;
  this->mJointType = joint->mJointType;
  this->mDoFCount = uVar6;
  this->q_index = uVar7;
  this->custom_joint_index = uVar8;
  pSVar9 = (SpatialVector *)operator_new__((ulong)uVar3 * 0x30);
  this->mJointAxes = pSVar9;
  if (uVar3 != 0) {
    lVar10 = 0x20;
    uVar11 = 0;
    do {
      pSVar9 = joint->mJointAxes;
      pSVar4 = this->mJointAxes;
      puVar1 = (undefined8 *)
               ((long)(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10 + -0x20);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      puVar1 = (undefined8 *)
               ((long)(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10 + -0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      puVar1 = (undefined8 *)
               ((long)(pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    } while (uVar11 < this->mDoFCount);
  }
  return;
}

Assistant:

Joint (const Joint &joint) :
    mJointType (joint.mJointType),
    mDoFCount (joint.mDoFCount),
    q_index (joint.q_index),
    custom_joint_index(joint.custom_joint_index)
  {
    mJointAxes = new Math::SpatialVector[mDoFCount];

    for (unsigned int i = 0; i < mDoFCount; i++) {
      mJointAxes[i] = joint.mJointAxes[i];
    }
  }